

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetMessageVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  mapped_type *pmVar5;
  mapped_type *this;
  FieldOptions *pFVar6;
  char *pcVar7;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int extraout_EDX;
  int extraout_EDX_00;
  int bitIndex_03;
  int bitIndex_04;
  allocator local_4f9;
  key_type local_4f8;
  allocator local_4d1;
  key_type local_4d0;
  string local_4b0;
  allocator local_489;
  key_type local_488;
  string local_468;
  allocator local_441;
  key_type local_440;
  allocator local_419;
  key_type local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator local_3d1;
  key_type local_3d0;
  allocator local_3a9;
  key_type local_3a8;
  allocator local_381;
  key_type local_380;
  string local_360;
  allocator local_339;
  key_type local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  allocator local_2d1;
  key_type local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator local_269;
  key_type local_268;
  string local_248;
  allocator local_221;
  key_type local_220;
  allocator local_1f9;
  key_type local_1f8;
  byte local_1d6;
  allocator local_1d5;
  byte local_1d4;
  byte local_1d3;
  byte local_1d2;
  allocator local_1d1;
  key_type local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  key_type local_168;
  allocator local_141;
  key_type local_140;
  allocator local_119;
  key_type local_118;
  string local_f8;
  allocator local_d1;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_71;
  key_type local_70;
  string local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  ClassNameResolver *name_resolver_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  local_30 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local = (ClassNameResolver *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  pmVar1 = variables_local;
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_50,(ClassNameResolver *)pmVar1,pDVar4);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"type",&local_71);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a8);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"kt_type",&local_d1);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](pmVar1,&local_d0);
  std::__cxx11::string::operator=((string *)this,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pmVar1 = variables_local;
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  ClassNameResolver::GetMutableClassName<google::protobuf::Descriptor>
            (&local_f8,(ClassNameResolver *)pmVar1,pDVar4);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"mutable_type",&local_119);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_118);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f8);
  TVar3 = GetType(_builderBitIndex_local);
  pmVar1 = local_30;
  pcVar7 = "jspb.Message";
  if (TVar3 == TYPE_GROUP) {
    pcVar7 = "msgOrGroup";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"group_or_message",&local_141);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_140);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7 + 5);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pFVar6 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar6);
  pmVar1 = local_30;
  pcVar7 = "";
  if (bVar2) {
    pcVar7 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"deprecation",&local_169);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_168);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  pFVar6 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar6);
  pmVar1 = local_30;
  local_1d2 = 0;
  local_1d3 = 0;
  local_1d4 = 0;
  local_1d6 = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_1d2 = 1;
    std::__cxx11::string::string((string *)&local_1d0,"name",&local_1d1);
    local_1d3 = 1;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1d0);
    std::operator+(&local_1b0,"@kotlin.Deprecated(message = \"Field ",pmVar5);
    local_1d4 = 1;
    std::operator+(&local_190,&local_1b0," is deprecated\") ");
  }
  else {
    std::allocator<char>::allocator();
    local_1d6 = 1;
    std::__cxx11::string::string((string *)&local_190,"",&local_1d5);
  }
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"kt_deprecation",&local_1f9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1f8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)&local_190);
  if ((local_1d6 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d5);
  }
  if ((local_1d4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  if ((local_1d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  if ((local_1d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  bVar2 = FieldDescriptor::is_required(_builderBitIndex_local);
  pmVar1 = local_30;
  pcVar7 = "false";
  if (bVar2) {
    pcVar7 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"required",&local_221);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_220);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  bVar2 = HasHasbit(_builderBitIndex_local);
  pmVar1 = local_30;
  if (bVar2) {
    GenerateGetBit_abi_cxx11_(&local_248,(java *)(ulong)info_local._4_4_,bitIndex);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"get_has_field_bit_message",&local_269);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_268);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string((string *)&local_248);
    GenerateSetBit_abi_cxx11_(&local_2b0,(java *)(ulong)info_local._4_4_,bitIndex_00);
    std::operator+(&local_290,&local_2b0,";");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d0,"set_has_field_bit_message",&local_2d1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_2d0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    GenerateClearBit_abi_cxx11_(&local_318,(java *)(ulong)info_local._4_4_,bitIndex_01);
    std::operator+(&local_2f8,&local_318,";");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,"clear_has_field_bit_message",&local_339);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_338);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    GenerateGetBit_abi_cxx11_(&local_360,(java *)(ulong)info_local._4_4_,bitIndex_02);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_380,"is_field_present_message",&local_381);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_380);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::__cxx11::string::~string((string *)&local_360);
    bitIndex_03 = extraout_EDX;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"set_has_field_bit_message",&local_3a9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3a8);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"clear_has_field_bit_message",&local_3d1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3d0);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"name",&local_419);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_418);
    std::operator+(&local_3f8,pmVar5,"_ != null");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_440,"is_field_present_message",&local_441);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_440);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    bitIndex_03 = extraout_EDX_00;
  }
  GenerateGetBitFromLocal_abi_cxx11_(&local_468,(java *)(ulong)(uint)info_local,bitIndex_03);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"get_has_field_bit_from_local",&local_489);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_488);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string((string *)&local_468);
  GenerateSetBitToLocal_abi_cxx11_(&local_4b0,(java *)(ulong)info_local._4_4_,bitIndex_04);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"set_has_field_bit_to_local",&local_4d1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_4d0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4b0);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"null_check",&local_4f9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_4f8);
  std::__cxx11::string::operator=((string *)pmVar5,"value.getClass();\n");
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor, int messageBitIndex,
                         int builderBitIndex, const FieldGeneratorInfo* info,
                         ClassNameResolver* name_resolver,
                         std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->message_type());
  (*variables)["kt_type"] = (*variables)["type"];
  (*variables)["mutable_type"] =
      name_resolver->GetMutableClassName(descriptor->message_type());
  (*variables)["group_or_message"] =
      (GetType(descriptor) == FieldDescriptor::TYPE_GROUP) ? "Group"
                                                           : "Message";
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["kt_deprecation"] =
      descriptor->options().deprecated()
          ? "@kotlin.Deprecated(message = \"Field " + (*variables)["name"] +
                " is deprecated\") "
          : "";
  (*variables)["on_changed"] = "onChanged();";
  (*variables)["ver"] = GeneratedCodeVersionSuffix();
  (*variables)["get_parser"] =
      ExposePublicParser(descriptor->message_type()->file()) ? "PARSER"
                                                             : "parser()";

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        (*variables)["name"] + "_ != null";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}